

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

string * google::protobuf::compiler::python::anon_unknown_0::ModuleName
                   (string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  string basename;
  undefined7 *local_68;
  string *local_60;
  undefined7 local_58;
  undefined4 uStack_51;
  undefined1 local_4d;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  local_58 = 0x646f746f72702e;
  uStack_51 = 0x6c657665;
  local_60 = (string *)0xb;
  local_4d = 0;
  local_68 = &local_58;
  if (filename->_M_string_length < 0xb) {
    __s = ".proto";
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((ulong)filename,filename->_M_string_length - 0xb,(string *)0xb);
    __s = ".proto";
    if (iVar2 == 0) {
      __s = ".protodevel";
    }
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT17((undefined1)uStack_51,local_58) + 1);
  }
  local_68 = &local_58;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar3);
  if (local_60 <= (string *)filename->_M_string_length) {
    iVar2 = std::__cxx11::string::compare
                      ((ulong)filename,(long)filename->_M_string_length - (long)local_60,local_60);
    if (iVar2 == 0) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)filename);
      goto LAB_001648e5;
    }
  }
  local_48 = local_38;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + filename->_M_string_length);
LAB_001648e5:
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT17((undefined1)uStack_51,local_58) + 1);
  }
  google::protobuf::StripString((string *)&local_48,"-",'_');
  google::protobuf::StripString((string *)&local_48,"/",'.');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_48,local_40 + (long)local_48);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string ModuleName(const string& filename) {
  string basename = StripProto(filename);
  StripString(&basename, "-", '_');
  StripString(&basename, "/", '.');
  return basename + "_pb2";
}